

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdaptorTest.cpp
# Opt level: O3

void __thiscall AdaptorTest_StackTest_Test::TestBody(AdaptorTest_StackTest_Test *this)

{
  int iVar1;
  bool bVar2;
  DataBlock **ppDVar3;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  stack<int,_Deque<int,_std::allocator<int>_>_> s;
  AssertHelper local_110;
  int local_104;
  Message local_100;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  AssertHelper local_f0;
  string local_e8;
  Deque<int,_std::allocator<int>_> local_c8;
  
  Deque<int,_std::allocator<int>_>::Deque(&local_c8,(allocator<int> *)&local_e8);
  local_e8._M_dataplus._M_p._0_4_ = 0;
  do {
    Deque<int,_std::allocator<int>_>::push_back(&local_c8,(value_type *)&local_e8);
    iVar1 = (int)local_e8._M_dataplus._M_p + 1;
    bVar2 = (int)local_e8._M_dataplus._M_p < 99;
    local_e8._M_dataplus._M_p._0_4_ = iVar1;
  } while (bVar2);
  local_104 = 99;
  while( true ) {
    local_100.ss_.ptr_._0_1_ = (internal)(local_c8.current_.size_ != 0);
    local_f8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8.current_.size_ == 0) {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)&local_100,(AssertionResult *)"s.empty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
                 ,0x11,(char *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,
                                        (int)local_e8._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_e8._M_dataplus._M_p._4_4_,(int)local_e8._M_dataplus._M_p) !=
          &local_e8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_e8._M_dataplus._M_p._4_4_,(int)local_e8._M_dataplus._M_p));
      }
      if (((local_110.data_ != (AssertHelperData *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_110.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_110.data_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      goto LAB_0012e67c;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ppDVar3 = local_c8.current_.arr_ + local_c8.current_.allocSize_;
    if (local_c8.current_.end_ != local_c8.current_.arr_) {
      ppDVar3 = local_c8.current_.end_;
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_e8,"s.top()","i",ppDVar3[-1]->end + -1,&local_104);
    if ((char)local_e8._M_dataplus._M_p == '\0') break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e8._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    Deque<int,_std::allocator<int>_>::pop_back(&local_c8);
    iVar1 = local_104 + -1;
    bVar2 = local_104 < 1;
    local_104 = iVar1;
    if (bVar2) {
LAB_0012e67c:
      Deque<int,_std::allocator<int>_>::~Deque(&local_c8);
      return;
    }
  }
  testing::Message::Message(&local_100);
  if ((undefined8 *)local_e8._M_string_length == (undefined8 *)0x0) {
    message = "";
  }
  else {
    message = *(char **)local_e8._M_string_length;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_110,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/AdaptorTest.cpp"
             ,0x12,message);
  testing::internal::AssertHelper::operator=(&local_110,&local_100);
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  if (((CONCAT71(local_100.ss_.ptr_._1_7_,local_100.ss_.ptr_._0_1_) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT71(local_100.ss_.ptr_._1_7_,local_100.ss_.ptr_._0_1_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT71(local_100.ss_.ptr_._1_7_,local_100.ss_.ptr_._0_1_) + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  goto LAB_0012e67c;
}

Assistant:

TEST(AdaptorTest, StackTest) {
    std::stack<int, Deque<int>> s;
    for (int i = 0; i < 100; ++i) {
        s.push(i);
    }

    for (int i = 99; i >= 0; --i) {
        ASSERT_FALSE(s.empty());
        ASSERT_EQ(s.top(), i);
        s.pop();
    }
}